

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O3

void multikey_simd<unsigned_char>(uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  uchar *puVar2;
  uint8_t *N_00;
  byte bVar3;
  int iVar4;
  size_t i;
  size_t sVar5;
  void *__src;
  uchar **ppuVar6;
  uchar **ppuVar7;
  byte bVar8;
  long lVar9;
  uint8_t *oracle;
  ulong n;
  array<unsigned_long,_3UL> bucketsize;
  size_t bucketindex [3];
  uint8_t *local_88;
  size_t sStack_80;
  size_t local_78;
  size_t local_68;
  uint8_t *local_60;
  size_t local_58;
  size_t local_50;
  long local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  if (N < 0x20) {
    if (1 < N) {
      ppuVar6 = strings;
      do {
        puVar1 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        for (ppuVar7 = ppuVar6; strings < ppuVar7; ppuVar7 = ppuVar7 + -1) {
          puVar2 = ppuVar7[-1];
          bVar3 = puVar2[depth];
          bVar8 = puVar1[depth];
          if ((bVar3 != 0) && (lVar9 = depth + 1, bVar3 == bVar8)) {
            do {
              bVar3 = puVar2[lVar9];
              bVar8 = puVar1[lVar9];
              if (bVar3 == 0) break;
              lVar9 = lVar9 + 1;
            } while (bVar3 == bVar8);
          }
          if (bVar3 <= bVar8) break;
          *ppuVar7 = puVar2;
        }
        iVar4 = (int)N;
        *ppuVar7 = puVar1;
        N = (size_t)(iVar4 - 1);
      } while (2 < iVar4);
    }
  }
  else {
    bVar3 = pseudo_median<unsigned_char>(strings,N,depth);
    iVar4 = posix_memalign(&local_88,0x10,N);
    oracle = local_88;
    if (iVar4 != 0) {
      oracle = (uint8_t *)0x0;
    }
    local_88 = (uint8_t *)0x0;
    sStack_80 = 0;
    local_78 = 0;
    n = N & 0xfffffffffffffff0;
    calculate_bucketsizes_sse<false>(strings,n,oracle,bVar3,depth);
    if (n != N) {
      do {
        if (strings[n] == (uchar *)0x0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x26,"unsigned char get_char(unsigned char *, size_t)");
        }
        bVar8 = strings[n][depth];
        oracle[n] = (bVar3 <= bVar8 && bVar8 != bVar3) * '\x02' | bVar8 == bVar3;
        n = n + 1;
      } while (n < N);
    }
    sVar5 = 0;
    do {
      (&local_88)[oracle[sVar5]] = (&local_88)[oracle[sVar5]] + 1;
      N_00 = local_88;
      sVar5 = sVar5 + 1;
    } while (N != sVar5);
    local_58 = sStack_80;
    local_60 = local_88 + sStack_80;
    local_50 = local_78;
    if (local_60 + local_78 != (uint8_t *)N) {
      __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                    ,0x127,
                    "void multikey_simd(unsigned char **, size_t, size_t) [CharT = unsigned char]");
    }
    local_68 = N * 8;
    __src = malloc(local_68);
    local_48 = 0;
    local_40 = N_00;
    local_38 = local_60;
    sVar5 = 0;
    do {
      puVar1 = strings[sVar5];
      lVar9 = (&local_48)[oracle[sVar5]];
      (&local_48)[oracle[sVar5]] = lVar9 + 1;
      *(uchar **)((long)__src + lVar9 * 8) = puVar1;
      sVar5 = sVar5 + 1;
    } while (N != sVar5);
    memcpy(strings,__src,local_68);
    free(__src);
    free(oracle);
    multikey_simd<unsigned_char>(strings,(size_t)N_00,depth);
    sVar5 = local_58;
    if (bVar3 != 0) {
      multikey_simd<unsigned_char>(strings + (long)N_00,local_58,depth + 1);
    }
    multikey_simd<unsigned_char>(strings + (long)(N_00 + sVar5),local_50,depth);
  }
  return;
}

Assistant:

static void
multikey_simd(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	uint8_t* const restrict oracle =
		static_cast<uint8_t*>(_mm_malloc(N, 16));
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<false>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i)
		++bucketsize[oracle[i]];
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	unsigned char** sorted =
		static_cast<unsigned char**>(malloc(N*sizeof(unsigned char*)));
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	free(sorted);
	_mm_free(oracle);
	multikey_simd<CharT>(strings, bucketsize[0], depth);
	if (not is_end(partval))
		multikey_simd<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT));
	multikey_simd<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
}